

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c++
# Opt level: O1

StringTree * __thiscall
capnp::JsonCodec::Impl::encodeRaw
          (StringTree *__return_storage_ptr__,Impl *this,Reader value,uint indent,bool *multiline,
          bool hasPrefix)

{
  char *pcVar1;
  size_t sVar2;
  Branch *pBVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  ArrayDisposer *pAVar6;
  StringTree *pSVar7;
  bool b;
  _func_int ***ppp_Var8;
  ushort uVar9;
  CappedArray<char,_32UL> *params;
  FixedArray<char,_1UL> *pFVar10;
  StringPtr *pSVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  StringPtr chars;
  Reader RVar14;
  StringPtr colon;
  uint subIndent;
  Array<kj::StringTree> encodedElements;
  Reader array;
  undefined1 local_173;
  undefined1 local_172;
  undefined1 local_171 [21];
  undefined1 local_15c [4];
  StringTree local_158;
  undefined1 local_118 [40];
  size_t local_f0;
  undefined1 local_e8 [48];
  undefined1 local_b8 [56];
  ArrayDisposer *pAStack_80;
  ArrayDisposer *pAStack_78;
  Array<kj::StringTree> local_68;
  Array<kj::StringTree> local_48;
  
  if (value._reader.dataSize < 0x10) {
    uVar9 = 0;
  }
  else {
    uVar9 = *value._reader.data;
  }
  if (uVar9 < 7) {
    local_171._1_8_ = __return_storage_ptr__;
    local_171._9_8_ = multiline;
    switch(uVar9) {
    case 0:
      local_158.text.content.ptr = (char *)0x4;
      local_158.size_ = (size_t)"null";
      kj::StringTree::concat<kj::ArrayPtr<char_const>>
                (__return_storage_ptr__,&local_158,
                 (ArrayPtr<const_char> *)
                 ((long)&switchD_00399752::switchdataD_00541e2c +
                 (long)(int)(&switchD_00399752::switchdataD_00541e2c)[uVar9]));
      break;
    case 1:
      if (value._reader.dataSize < 0x11) {
        b = false;
      }
      else {
        b = (bool)(*(byte *)((long)value._reader.data + 2) & 1);
      }
      local_158._0_16_ = kj::_::Stringifier::operator*((Stringifier *)&kj::_::STR,b);
      kj::StringTree::concat<kj::StringPtr>(__return_storage_ptr__,(StringPtr *)&local_158);
      break;
    case 2:
      uVar12 = 0;
      uVar13 = 0;
      if (0x7f < value._reader.dataSize) {
        uVar12 = (undefined4)*(undefined8 *)((long)value._reader.data + 8);
        uVar13 = (undefined4)((ulong)*(undefined8 *)((long)value._reader.data + 8) >> 0x20);
      }
      kj::_::Stringifier::operator*
                ((CappedArray<char,_32UL> *)&local_158,(Stringifier *)&kj::_::STR,
                 (double)CONCAT44(uVar13,uVar12));
      kj::StringTree::concat<kj::CappedArray<char,32ul>>(__return_storage_ptr__,&local_158,params);
      break;
    case 3:
      if (value._reader.pointerCount == 0) {
        value._reader.nestingLimit = 0x7fffffff;
        value._reader.capTable = (CapTableReader *)0x0;
        value._reader.pointers = (WirePointer *)0x0;
        value._reader.segment = (SegmentReader *)0x0;
      }
      local_158.text.content.disposer =
           (ArrayDisposer *)
           CONCAT44(local_158.text.content.disposer._4_4_,value._reader.nestingLimit);
      local_158.text.content.size_ = (size_t)value._reader.pointers;
      local_158.size_ = (size_t)value._reader.segment;
      local_158.text.content.ptr = (char *)value._reader.capTable;
      chars.content =
           (ArrayPtr<const_char>)
           capnp::_::PointerReader::getBlob<capnp::Text>((PointerReader *)&local_158,(void *)0x0,0);
      encodeString((String *)&local_158,this,chars);
      ppp_Var8 = (_func_int ***)
                 ((long)&(((StringPtr *)((long)local_158.text.content.ptr + 0xfffffffffffffff0))->
                         content).size_ + 7);
      if ((StringPtr *)local_158.text.content.ptr == (StringPtr *)0x0) {
        ppp_Var8 = (_func_int ***)(undefined1 *)0x0;
      }
      __return_storage_ptr__->size_ = (size_t)ppp_Var8;
      (__return_storage_ptr__->text).content.ptr = (char *)local_158.size_;
      (__return_storage_ptr__->text).content.size_ = (size_t)local_158.text.content.ptr;
      (__return_storage_ptr__->text).content.disposer =
           (ArrayDisposer *)local_158.text.content.size_;
      (__return_storage_ptr__->branches).ptr = (Branch *)0x0;
      (__return_storage_ptr__->branches).size_ = 0;
      (__return_storage_ptr__->branches).disposer = (ArrayDisposer *)0x0;
      break;
    case 4:
      if (value._reader.pointerCount == 0) {
        value._reader.nestingLimit = 0x7fffffff;
        value._reader.capTable = (CapTableReader *)0x0;
        value._reader.pointers = (WirePointer *)0x0;
        value._reader.segment = (SegmentReader *)0x0;
      }
      local_158.text.content.disposer =
           (ArrayDisposer *)
           CONCAT44(local_158.text.content.disposer._4_4_,value._reader.nestingLimit);
      local_158.text.content.size_ = (size_t)value._reader.pointers;
      local_158.size_ = (size_t)value._reader.segment;
      local_158.text.content.ptr = (char *)value._reader.capTable;
      capnp::_::PointerReader::getList
                ((ListReader *)local_b8,(PointerReader *)&local_158,INLINE_COMPOSITE,(word *)0x0);
      local_118._32_4_ = (indent + 1) - (uint)((uint)local_b8._24_4_ < 2);
      local_158.text.content.size_ = (size_t)&local_173;
      local_173 = false;
      local_158.text.content.ptr = local_118 + 0x20;
      local_158.size_ = (size_t)this;
      local_118._0_8_ = (ListReader *)local_b8;
      kj::_::Mapper<capnp::List<capnp::json::Value,_(capnp::Kind)3>::Reader_&>::
      operator*<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_compat_json_c__:63:32)>
                ((Array<kj::StringTree> *)local_e8,
                 (Mapper<capnp::List<capnp::json::Value,_(capnp::Kind)3>::Reader_&> *)local_118,
                 (anon_class_24_3_b5b61ab8 *)&local_158);
      local_48.ptr = (StringTree *)local_e8._0_8_;
      local_48.size_ = local_e8._8_8_;
      local_48.disposer = (ArrayDisposer *)local_e8._16_8_;
      local_e8._0_8_ = (StringTree *)0x0;
      local_e8._8_8_ = 0;
      pFVar10 = (FixedArray<char,_1UL> *)(ulong)indent;
      encodeList(&local_158,this,&local_48,(bool)local_173,indent,(bool *)local_171._9_8_,hasPrefix)
      ;
      __return_storage_ptr__ = (StringTree *)local_171._1_8_;
      local_118[0] = 0x5b;
      local_15c[0] = 0x5d;
      kj::StringTree::concat<kj::FixedArray<char,1ul>,kj::StringTree,kj::FixedArray<char,1ul>>
                ((StringTree *)local_171._1_8_,(StringTree *)local_118,
                 (FixedArray<char,_1UL> *)&local_158,(StringTree *)(local_171 + 0x15),pFVar10);
      sVar2 = local_158.branches.size_;
      pBVar3 = local_158.branches.ptr;
      if (local_158.branches.ptr != (Branch *)0x0) {
        local_158.branches.ptr = (Branch *)0x0;
        local_158.branches.size_ = 0;
        (**(local_158.branches.disposer)->_vptr_ArrayDisposer)
                  (local_158.branches.disposer,pBVar3,0x40,sVar2,sVar2,
                   kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
      }
      sVar2 = local_158.text.content.size_;
      pcVar1 = local_158.text.content.ptr;
      if ((StringPtr *)local_158.text.content.ptr != (StringPtr *)0x0) {
        local_158.text.content.ptr = (char *)0x0;
        local_158.text.content.size_ = 0;
        (**(local_158.text.content.disposer)->_vptr_ArrayDisposer)
                  (local_158.text.content.disposer,pcVar1,1,sVar2,sVar2,0);
      }
      sVar2 = local_48.size_;
      pSVar7 = local_48.ptr;
      if (local_48.ptr != (StringTree *)0x0) {
        local_48.ptr = (StringTree *)0x0;
        local_48.size_ = 0;
        (**(local_48.disposer)->_vptr_ArrayDisposer)
                  (local_48.disposer,pSVar7,0x38,sVar2,sVar2,
                   kj::ArrayDisposer::Dispose_<kj::StringTree,_false>::destruct);
      }
      uVar5 = local_e8._8_8_;
      uVar4 = local_e8._0_8_;
      if ((StringTree *)local_e8._0_8_ != (StringTree *)0x0) {
        local_e8._0_8_ = (StringTree *)0x0;
        local_e8._8_8_ = 0;
        (***(_func_int ***)local_e8._16_8_)
                  (local_e8._16_8_,uVar4,0x38,uVar5,uVar5,
                   kj::ArrayDisposer::Dispose_<kj::StringTree,_false>::destruct);
      }
      break;
    case 5:
      if (value._reader.pointerCount == 0) {
        value._reader.nestingLimit = 0x7fffffff;
        value._reader.capTable = (CapTableReader *)0x0;
        value._reader.pointers = (WirePointer *)0x0;
        value._reader.segment = (SegmentReader *)0x0;
      }
      local_158.text.content.disposer =
           (ArrayDisposer *)
           CONCAT44(local_158.text.content.disposer._4_4_,value._reader.nestingLimit);
      local_158.text.content.size_ = (size_t)value._reader.pointers;
      local_158.size_ = (size_t)value._reader.segment;
      local_158.text.content.ptr = (char *)value._reader.capTable;
      capnp::_::PointerReader::getList
                ((ListReader *)local_b8,(PointerReader *)&local_158,INLINE_COMPOSITE,(word *)0x0);
      local_15c = (undefined1  [4])((indent + 1) - (uint)((uint)local_b8._24_4_ < 2));
      local_158.text.content.size_ = (size_t)(local_171 + 0x15);
      local_158.text.content.disposer = (ArrayDisposer *)local_171;
      local_171[0] = false;
      local_118._0_8_ = ":";
      if ((ulong)this->prettyPrint != 0) {
        local_118._0_8_ = ": ";
      }
      local_118._8_8_ = (ulong)this->prettyPrint | 2;
      local_158.text.content.ptr = local_118;
      local_158.size_ = (size_t)this;
      local_118._32_8_ = (Branch *)local_b8;
      kj::_::Mapper<capnp::List<capnp::json::Value::Field,_(capnp::Kind)3>::Reader_&>::
      operator*<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_compat_json_c__:76:32)>
                ((Array<kj::StringTree> *)local_e8,
                 (Mapper<capnp::List<capnp::json::Value::Field,_(capnp::Kind)3>::Reader_&> *)
                 (local_118 + 0x20),(anon_class_32_4_977eede9 *)&local_158);
      local_68.ptr = (StringTree *)local_e8._0_8_;
      local_68.size_ = local_e8._8_8_;
      local_68.disposer = (ArrayDisposer *)local_e8._16_8_;
      local_e8._0_8_ = (StringTree *)0x0;
      local_e8._8_8_ = 0;
      pFVar10 = (FixedArray<char,_1UL> *)(ulong)indent;
      encodeList(&local_158,this,&local_68,(bool)local_171[0],indent,(bool *)local_171._9_8_,
                 hasPrefix);
      __return_storage_ptr__ = (StringTree *)local_171._1_8_;
      local_118[0x20] = 0x7b;
      local_173 = 0x7d;
      kj::StringTree::concat<kj::FixedArray<char,1ul>,kj::StringTree,kj::FixedArray<char,1ul>>
                ((StringTree *)local_171._1_8_,(StringTree *)(local_118 + 0x20),
                 (FixedArray<char,_1UL> *)&local_158,(StringTree *)&local_173,pFVar10);
      sVar2 = local_158.branches.size_;
      pBVar3 = local_158.branches.ptr;
      if (local_158.branches.ptr != (Branch *)0x0) {
        local_158.branches.ptr = (Branch *)0x0;
        local_158.branches.size_ = 0;
        (**(local_158.branches.disposer)->_vptr_ArrayDisposer)
                  (local_158.branches.disposer,pBVar3,0x40,sVar2,sVar2,
                   kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
      }
      sVar2 = local_158.text.content.size_;
      pcVar1 = local_158.text.content.ptr;
      if ((StringPtr *)local_158.text.content.ptr != (StringPtr *)0x0) {
        local_158.text.content.ptr = (char *)0x0;
        local_158.text.content.size_ = 0;
        (**(local_158.text.content.disposer)->_vptr_ArrayDisposer)
                  (local_158.text.content.disposer,pcVar1,1,sVar2,sVar2,0);
      }
      sVar2 = local_68.size_;
      pSVar7 = local_68.ptr;
      if (local_68.ptr != (StringTree *)0x0) {
        local_68.ptr = (StringTree *)0x0;
        local_68.size_ = 0;
        (**(local_68.disposer)->_vptr_ArrayDisposer)
                  (local_68.disposer,pSVar7,0x38,sVar2,sVar2,
                   kj::ArrayDisposer::Dispose_<kj::StringTree,_false>::destruct);
      }
      uVar5 = local_e8._8_8_;
      uVar4 = local_e8._0_8_;
      if ((StringTree *)local_e8._0_8_ != (StringTree *)0x0) {
        local_e8._0_8_ = (StringTree *)0x0;
        local_e8._8_8_ = 0;
        (***(_func_int ***)local_e8._16_8_)
                  (local_e8._16_8_,uVar4,0x38,uVar5,uVar5,
                   kj::ArrayDisposer::Dispose_<kj::StringTree,_false>::destruct);
      }
      break;
    case 6:
      if (value._reader.pointerCount == 0) {
        value._reader.capTable = (CapTableReader *)0x0;
        value._reader.pointers = (WirePointer *)0x0;
        value._reader.segment = (SegmentReader *)0x0;
        value._reader.nestingLimit = 0x7fffffff;
      }
      local_158.text.content.size_ = (size_t)value._reader.pointers;
      local_158.size_ = (size_t)value._reader.segment;
      local_158.text.content.ptr = (char *)value._reader.capTable;
      local_158.text.content.disposer._0_4_ = value._reader.nestingLimit;
      capnp::_::PointerReader::getStruct
                ((StructReader *)local_b8,(PointerReader *)&local_158,(word *)0x0);
      local_158.text.content.size_ = 0;
      local_158.size_ = 0;
      local_158.text.content.ptr = (char *)(StringPtr *)0x0;
      local_158.text.content.disposer._0_4_ = 0x7fffffff;
      if (1 < (ushort)local_b8._36_2_) {
        local_158.size_ = CONCAT44(local_b8._4_4_,local_b8._0_4_);
        local_158.text.content.size_ = CONCAT44(local_b8._28_4_,local_b8._24_4_) + 8;
        local_158.text.content.ptr = (char *)local_b8._8_8_;
        local_158.text.content.disposer._0_4_ = local_b8._40_4_;
      }
      pSVar11 = (StringPtr *)0x0;
      capnp::_::PointerReader::getList
                ((ListReader *)local_e8,(PointerReader *)&local_158,INLINE_COMPOSITE,(word *)0x0);
      local_15c = (undefined1  [4])((indent + 1) - (uint)((uint)local_e8._24_4_ < 2));
      local_158.text.content.ptr = local_171 + 0x15;
      local_158.text.content.size_ = (size_t)&local_172;
      local_172 = 0;
      local_118._32_8_ = (Branch *)local_e8;
      local_158.size_ = (size_t)this;
      kj::_::Mapper<capnp::List<capnp::json::Value,_(capnp::Kind)3>::Reader_&>::
      operator*<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_compat_json_c__:91:32)>
                ((Array<kj::StringTree> *)local_118,
                 (Mapper<capnp::List<capnp::json::Value,_(capnp::Kind)3>::Reader_&> *)
                 (local_118 + 0x20),(anon_class_24_3_b5b61ab8 *)&local_158);
      if (local_b8._36_2_ == 0) {
        local_b8._40_4_ = 0x7fffffff;
        local_158.text.content.size_ = 0;
        local_158.size_ = 0;
      }
      else {
        local_158.size_ = CONCAT44(local_b8._4_4_,local_b8._0_4_);
        local_158.text.content.size_ = CONCAT44(local_b8._28_4_,local_b8._24_4_);
        pSVar11 = (StringPtr *)local_b8._8_8_;
      }
      local_158.text.content.ptr = (char *)pSVar11;
      local_158.text.content.disposer =
           (ArrayDisposer *)CONCAT44(local_158.text.content.disposer._4_4_,local_b8._40_4_);
      RVar14 = capnp::_::PointerReader::getBlob<capnp::Text>
                         ((PointerReader *)&local_158,(void *)0x0,0);
      local_b8._48_8_ = local_118._0_8_;
      pAStack_80 = (ArrayDisposer *)local_118._8_8_;
      pAStack_78 = (ArrayDisposer *)local_118._16_8_;
      local_118._0_8_ = (Reader *)0x0;
      local_118._8_8_ = (char *)0x0;
      pFVar10 = (FixedArray<char,_1UL> *)local_171._9_8_;
      encodeList(&local_158,this,(Array<kj::StringTree> *)(local_b8 + 0x30),(bool)local_172,indent,
                 (bool *)local_171._9_8_,true);
      __return_storage_ptr__ = (StringTree *)local_171._1_8_;
      local_f0 = RVar14.super_StringPtr.content.size_ - 1;
      local_173 = 0x28;
      local_171[0] = 0x29;
      local_118._32_8_ = RVar14.super_StringPtr.content.ptr;
      kj::StringTree::
      concat<kj::ArrayPtr<char_const>,kj::FixedArray<char,1ul>,kj::StringTree,kj::FixedArray<char,1ul>>
                ((StringTree *)local_171._1_8_,(StringTree *)(local_118 + 0x20),
                 (ArrayPtr<const_char> *)&local_173,(FixedArray<char,_1UL> *)&local_158,
                 (StringTree *)local_171,pFVar10);
      sVar2 = local_158.branches.size_;
      pBVar3 = local_158.branches.ptr;
      if (local_158.branches.ptr != (Branch *)0x0) {
        local_158.branches.ptr = (Branch *)0x0;
        local_158.branches.size_ = 0;
        (**(local_158.branches.disposer)->_vptr_ArrayDisposer)
                  (local_158.branches.disposer,pBVar3,0x40,sVar2,sVar2,
                   kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
      }
      sVar2 = local_158.text.content.size_;
      pcVar1 = local_158.text.content.ptr;
      if ((StringPtr *)local_158.text.content.ptr != (StringPtr *)0x0) {
        local_158.text.content.ptr = (char *)0x0;
        local_158.text.content.size_ = 0;
        (**(local_158.text.content.disposer)->_vptr_ArrayDisposer)
                  (local_158.text.content.disposer,pcVar1,1,sVar2,sVar2,0);
      }
      pAVar6 = pAStack_80;
      uVar4 = local_b8._48_8_;
      if ((Reader *)local_b8._48_8_ != (Reader *)0x0) {
        local_b8._48_8_ = (Reader *)0x0;
        pAStack_80 = (ArrayDisposer *)0x0;
        (**pAStack_78->_vptr_ArrayDisposer)
                  (pAStack_78,uVar4,0x38,pAVar6,pAVar6,
                   kj::ArrayDisposer::Dispose_<kj::StringTree,_false>::destruct);
      }
      uVar5 = local_118._8_8_;
      uVar4 = local_118._0_8_;
      if ((Reader *)local_118._0_8_ != (Reader *)0x0) {
        local_118._0_8_ = (Reader *)0x0;
        local_118._8_8_ = (char *)0x0;
        (***(_func_int ***)local_118._16_8_)
                  (local_118._16_8_,uVar4,0x38,uVar5,uVar5,
                   kj::ArrayDisposer::Dispose_<kj::StringTree,_false>::destruct);
      }
    }
    return __return_storage_ptr__;
  }
  local_b8._0_4_ = 0;
  if (0xf < value._reader.dataSize) {
    local_b8._0_4_ = ZEXT24(*value._reader.data);
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[23],unsigned_int>
            ((Fault *)&local_158,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compat/json.c++"
             ,100,FAILED,(char *)0x0,"\"unknown JsonValue type\", static_cast<uint>(value.which())",
             (char (*) [23])"unknown JsonValue type",(uint *)local_b8);
  kj::_::Debug::Fault::fatal((Fault *)&local_158);
}

Assistant:

kj::StringTree encodeRaw(JsonValue::Reader value, uint indent, bool& multiline,
                           bool hasPrefix) const {
    switch (value.which()) {
      case JsonValue::NULL_:
        return kj::strTree("null");
      case JsonValue::BOOLEAN:
        return kj::strTree(value.getBoolean());
      case JsonValue::NUMBER:
        return kj::strTree(value.getNumber());

      case JsonValue::STRING:
        return kj::strTree(encodeString(value.getString()));

      case JsonValue::ARRAY: {
        auto array = value.getArray();
        uint subIndent = indent + (array.size() > 1);
        bool childMultiline = false;
        auto encodedElements = KJ_MAP(element, array) {
          return encodeRaw(element, subIndent, childMultiline, false);
        };

        return kj::strTree('[', encodeList(
            kj::mv(encodedElements), childMultiline, indent, multiline, hasPrefix), ']');
      }

      case JsonValue::OBJECT: {
        auto object = value.getObject();
        uint subIndent = indent + (object.size() > 1);
        bool childMultiline = false;
        kj::StringPtr colon = prettyPrint ? ": " : ":";
        auto encodedElements = KJ_MAP(field, object) {
          return kj::strTree(
              encodeString(field.getName()), colon,
              encodeRaw(field.getValue(), subIndent, childMultiline, true));
        };

        return kj::strTree('{', encodeList(
            kj::mv(encodedElements), childMultiline, indent, multiline, hasPrefix), '}');
      }

      case JsonValue::CALL: {
        auto call = value.getCall();
        auto params = call.getParams();
        uint subIndent = indent + (params.size() > 1);
        bool childMultiline = false;
        auto encodedElements = KJ_MAP(element, params) {
          return encodeRaw(element, subIndent, childMultiline, false);
        };

        return kj::strTree(call.getFunction(), '(', encodeList(
            kj::mv(encodedElements), childMultiline, indent, multiline, true), ')');
      }
    }

    KJ_FAIL_ASSERT("unknown JsonValue type", static_cast<uint>(value.which()));
  }